

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

void __thiscall
FString::Substitute(FString *this,char *oldstr,char *newstr,size_t oldstrlen,size_t newstrlen)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  LockBuffer(this);
  uVar4 = 0;
  do {
    pcVar1 = this->Chars;
    uVar5 = (ulong)*(uint *)(pcVar1 + -0xc);
    if (uVar5 <= uVar4) break;
    pcVar2 = strstr(pcVar1 + uVar4,oldstr);
    if (pcVar2 != (char *)0x0) {
      lVar3 = (long)pcVar2 - (long)pcVar1;
      if (newstrlen != oldstrlen) {
        ReallocBuffer(this,(newstrlen - oldstrlen) + uVar5);
        memmove(this->Chars + newstrlen + lVar3,this->Chars + oldstrlen + lVar3,
                (uVar5 - (oldstrlen + lVar3)) + 1);
      }
      memcpy(this->Chars + lVar3,newstr,newstrlen);
      uVar4 = lVar3 + newstrlen;
    }
  } while (pcVar2 != (char *)0x0);
  UnlockBuffer(this);
  return;
}

Assistant:

void FString::Substitute (const char *oldstr, const char *newstr, size_t oldstrlen, size_t newstrlen)
{
	LockBuffer();
	for (size_t checkpt = 0; checkpt < Len(); )
	{
		char *match = strstr (Chars + checkpt, oldstr);
		size_t len = Len();
		if (match != NULL)
		{
			size_t matchpt = match - Chars;
			if (oldstrlen != newstrlen)
			{
				ReallocBuffer (len + newstrlen - oldstrlen);
				memmove (Chars + matchpt + newstrlen, Chars + matchpt + oldstrlen, (len + 1 - matchpt - oldstrlen)*sizeof(char));
			}
			memcpy (Chars + matchpt, newstr, newstrlen);
			checkpt = matchpt + newstrlen;
		}
		else
		{
			break;
		}
	}
	UnlockBuffer();
}